

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall tinyusdz::MetaVariable::~MetaVariable(MetaVariable *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  vtable_type *pvVar3;
  
  pcVar2 = (this->_name)._M_dataplus._M_p;
  paVar1 = &(this->_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pvVar3 = (this->_value).v_.vtable;
  if (pvVar3 != (vtable_type *)0x0) {
    (*pvVar3->destroy)((storage_union *)this);
    (this->_value).v_.vtable = (vtable_type *)0x0;
  }
  return;
}

Assistant:

MetaVariable &operator=(const MetaVariable &rhs) {
    _name = rhs._name;
    _value = rhs._value;

    return *this;
  }